

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O0

bool SpeedECDSA(string *selected)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  EC_GROUP *pEVar4;
  bool local_da;
  allocator<char> local_c1;
  string local_c0;
  byte local_9b;
  byte local_9a;
  allocator<char> local_99;
  string local_98;
  byte local_73;
  byte local_72;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *selected_local;
  
  local_18 = selected;
  std::allocator<char>::allocator();
  local_72 = 0;
  local_73 = 0;
  local_9a = 0;
  local_9b = 0;
  bVar2 = false;
  bVar1 = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ECDSA P-224",&local_39);
  pEVar4 = EC_group_p224();
  bVar3 = SpeedECDSACurve(&local_38,pEVar4,local_18);
  local_da = false;
  if (bVar3) {
    std::allocator<char>::allocator();
    local_72 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"ECDSA P-256",&local_71);
    local_73 = 1;
    pEVar4 = EC_group_p256();
    bVar3 = SpeedECDSACurve(&local_70,pEVar4,local_18);
    local_da = false;
    if (bVar3) {
      std::allocator<char>::allocator();
      local_9a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"ECDSA P-384",&local_99);
      local_9b = 1;
      pEVar4 = EC_group_p384();
      bVar3 = SpeedECDSACurve(&local_98,pEVar4,local_18);
      local_da = false;
      if (bVar3) {
        std::allocator<char>::allocator();
        bVar2 = true;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"ECDSA P-521",&local_c1);
        bVar1 = true;
        pEVar4 = EC_group_p521();
        local_da = SpeedECDSACurve(&local_c0,pEVar4,local_18);
      }
    }
  }
  selected_local._7_1_ = local_da;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(&local_c1);
  }
  if ((local_9b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_9a & 1) != 0) {
    std::allocator<char>::~allocator(&local_99);
  }
  if ((local_73 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_72 & 1) != 0) {
    std::allocator<char>::~allocator(&local_71);
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return (bool)(selected_local._7_1_ & 1);
}

Assistant:

static bool SpeedECDSA(const std::string &selected) {
  return SpeedECDSACurve("ECDSA P-224", EC_group_p224(), selected) &&
         SpeedECDSACurve("ECDSA P-256", EC_group_p256(), selected) &&
         SpeedECDSACurve("ECDSA P-384", EC_group_p384(), selected) &&
         SpeedECDSACurve("ECDSA P-521", EC_group_p521(), selected);
}